

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

uint64_t search_one(int *lev,int nb_strengths,uint64_t (*mse) [64],int sb_count,
                   CDEF_PICK_METHOD pick_method)

{
  uint uVar1;
  ulong uVar2;
  uint64_t (*pauVar3) [64];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t tot_mse [64];
  ulong local_238 [65];
  
  uVar9 = 0x8000000000000000;
  uVar1 = nb_cdef_strengths[pick_method];
  uVar5 = 0;
  memset(local_238,0,0x200);
  uVar2 = 0;
  if (0 < nb_strengths) {
    uVar2 = (ulong)(uint)nb_strengths;
  }
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar5;
  }
  pauVar3 = mse;
  uVar10 = (ulong)(uint)sb_count;
  if (sb_count < 1) {
    uVar10 = uVar5;
  }
  for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    uVar4 = 0x8000000000000000;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      if (mse[uVar5][lev[uVar6]] < uVar4) {
        uVar4 = mse[uVar5][lev[uVar6]];
      }
    }
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = (*pauVar3)[uVar6];
      if (uVar4 <= (*pauVar3)[uVar6]) {
        uVar7 = uVar4;
      }
      local_238[uVar6] = local_238[uVar6] + uVar7;
    }
    pauVar3 = pauVar3 + 1;
  }
  uVar5 = 0;
  for (uVar2 = 0; uVar8 != uVar2; uVar2 = uVar2 + 1) {
    if (local_238[uVar2] < uVar9) {
      uVar5 = uVar2 & 0xffffffff;
      uVar9 = local_238[uVar2];
    }
  }
  lev[nb_strengths] = (int)uVar5;
  return uVar9;
}

Assistant:

static uint64_t search_one(int *lev, int nb_strengths,
                           uint64_t mse[][TOTAL_STRENGTHS], int sb_count,
                           CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS];
  const int total_strengths = nb_cdef_strengths[pick_method];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id = 0;
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      if (mse[i][lev[gi]] < best_mse) {
        best_mse = mse[i][lev[gi]];
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      uint64_t best = best_mse;
      if (mse[i][j] < best) best = mse[i][j];
      tot_mse[j] += best;
    }
  }
  for (j = 0; j < total_strengths; j++) {
    if (tot_mse[j] < best_tot_mse) {
      best_tot_mse = tot_mse[j];
      best_id = j;
    }
  }
  lev[nb_strengths] = best_id;
  return best_tot_mse;
}